

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_alpn_comma_to_openssl(char *comma,uint8_t *os,int len)

{
  uint8_t *local_38;
  uint8_t *plen;
  uint8_t *oos;
  uint8_t *puStack_20;
  int len_local;
  uint8_t *os_local;
  char *comma_local;
  
  local_38 = (uint8_t *)0x0;
  oos._4_4_ = len;
  puStack_20 = os;
  os_local = (uint8_t *)comma;
  if (comma == (char *)0x0) {
    comma_local._4_4_ = 0;
  }
  else {
    while (*os_local != '\0' && 2 < oos._4_4_) {
      if ((local_38 == (uint8_t *)0x0) && (*os_local == ' ')) {
        os_local = os_local + 1;
      }
      else {
        if (local_38 == (uint8_t *)0x0) {
          local_38 = puStack_20;
          oos._4_4_ = oos._4_4_ + -1;
          puStack_20 = puStack_20 + 1;
        }
        if (*os_local == ',') {
          *local_38 = (char)puStack_20 - ((char)local_38 + '\x01');
          local_38 = (uint8_t *)0x0;
        }
        else {
          *puStack_20 = *os_local;
          oos._4_4_ = oos._4_4_ + -1;
          puStack_20 = puStack_20 + 1;
        }
        os_local = os_local + 1;
      }
    }
    if (local_38 != (uint8_t *)0x0) {
      *local_38 = (char)puStack_20 - ((char)local_38 + '\x01');
    }
    *puStack_20 = '\0';
    comma_local._4_4_ = (int)puStack_20 - (int)os;
  }
  return comma_local._4_4_;
}

Assistant:

int
lws_alpn_comma_to_openssl(const char *comma, uint8_t *os, int len)
{
	uint8_t *oos = os, *plen = NULL;

	if (!comma)
		return 0;

	while (*comma && len > 2) {
		if (!plen && *comma == ' ') {
			comma++;
			continue;
		}
		if (!plen) {
			plen = os++;
			len--;
		}

		if (*comma == ',') {
			*plen = (uint8_t)lws_ptr_diff(os, plen + 1);
			plen = NULL;
			comma++;
		} else {
			*os++ = (uint8_t)*comma++;
			len--;
		}
	}

	if (plen)
		*plen = (uint8_t)lws_ptr_diff(os, plen + 1);

	*os = 0;

	return lws_ptr_diff(os, oos);
}